

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O2

int convert_YCoCg_to_RGB(uchar *orig,int width,int height,int channels)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uchar uVar9;
  
  iVar6 = -1;
  if ((((orig != (uchar *)0x0) && (0 < width)) && (0 < height)) && (0xfffffffd < channels - 5U)) {
    if (channels == 3) {
      for (uVar8 = 0; uVar8 < (uint)(height * width * 3); uVar8 = uVar8 + 3) {
        bVar1 = orig[uVar8];
        bVar2 = orig[uVar8 + 1];
        bVar3 = orig[uVar8 + 2];
        iVar6 = (((uint)bVar1 + (uint)bVar2) - (uint)bVar3) + -0x80;
        if (0x7e < iVar6) {
          iVar6 = 0x7f;
        }
        cVar5 = (char)iVar6;
        if (iVar6 < -0x7f) {
          cVar5 = -0x80;
        }
        iVar6 = (uint)bVar3 + (uint)bVar2 + -0x80;
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        uVar9 = (uchar)iVar6;
        if (iVar6 < 1) {
          uVar9 = '\0';
        }
        orig[uVar8] = cVar5 + 0x80;
        orig[uVar8 + 1] = uVar9;
        uVar4 = (uint)bVar2 - ((uint)bVar1 + (uint)bVar3);
        if (-2 < (int)uVar4) {
          uVar4 = 0xffffffff;
        }
        uVar9 = (uchar)uVar4;
        if (uVar4 < 0xffffff01) {
          uVar9 = '\0';
        }
        orig[uVar8 + 2] = uVar9;
      }
    }
    else {
      for (uVar8 = 0; uVar8 < (uint)(height * width * 4); uVar8 = uVar8 + 4) {
        bVar1 = orig[uVar8 + 1];
        bVar2 = orig[uVar8 + 3];
        iVar6 = ((uint)orig[uVar8] - (uint)bVar1) + (uint)bVar2;
        if (0xfe < iVar6) {
          iVar6 = 0xff;
        }
        if (iVar6 < 1) {
          iVar6 = 0;
        }
        iVar7 = (uint)bVar1 + (uint)bVar2 + -0x80;
        if (0xfe < iVar7) {
          iVar7 = 0xff;
        }
        if (iVar7 < 1) {
          iVar7 = 0;
        }
        uVar9 = orig[uVar8 + 2];
        uVar4 = (uint)bVar2 - ((uint)orig[uVar8] + (uint)bVar1);
        if (-2 < (int)uVar4) {
          uVar4 = 0xffffffff;
        }
        orig[uVar8] = (uchar)iVar6;
        if (uVar4 < 0xffffff01) {
          uVar4 = 0;
        }
        orig[uVar8 + 1] = (uchar)iVar7;
        orig[uVar8 + 2] = (uchar)uVar4;
        orig[uVar8 + 3] = uVar9;
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int
	convert_YCoCg_to_RGB
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	int i;
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 3) || (channels > 4) ||
		(orig == NULL) )
	{
		/*	nothing to do	*/
		return -1;
	}
	/*	do the conversion	*/
	if( channels == 3 )
	{
		for( i = 0; i < width*height*3; i += 3 )
		{
			int co = orig[i+0] - 128;
			int y  = orig[i+1];
			int cg = orig[i+2] - 128;
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
		}
	} else
	{
		for( i = 0; i < width*height*4; i += 4 )
		{
			int co = orig[i+0] - 128;
			int cg = orig[i+1] - 128;
			unsigned char a  = orig[i+2];
			int y  = orig[i+3];
			/*	R	*/
			orig[i+0] = clamp_byte( y + co - cg );
			/*	G	*/
			orig[i+1] = clamp_byte( y + cg );
			/*	B	*/
			orig[i+2] = clamp_byte( y - co - cg );
			/*	A	*/
			orig[i+3] = a;
		}
	}
	/*	done	*/
	return 0;
}